

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elfio.hpp
# Opt level: O3

bool __thiscall ELFIO::elfio::load_sections(elfio *this,istream *stream,bool is_lazy)

{
  elf_header *peVar1;
  elfio *peVar2;
  pointer puVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  Elf_Word index;
  undefined4 extraout_var;
  section *psVar8;
  undefined4 extraout_var_00;
  char *__s;
  size_t sVar9;
  bool bVar10;
  _Head_base<0UL,_ELFIO::section_*,_false> _Var11;
  long lVar12;
  ushort uVar13;
  ulong uVar14;
  string_section_accessor str_reader;
  long *local_58 [2];
  long local_48 [2];
  _Head_base<0UL,_ELFIO::section_*,_false> local_38;
  
  iVar4 = (*((this->header)._M_t.
             super___uniq_ptr_impl<ELFIO::elf_header,_std::default_delete<ELFIO::elf_header>_>._M_t.
             super__Tuple_impl<0UL,_ELFIO::elf_header_*,_std::default_delete<ELFIO::elf_header>_>.
             super__Head_base<0UL,_ELFIO::elf_header_*,_false>._M_head_impl)->_vptr_elf_header[4])()
  ;
  uVar5 = (*((this->header)._M_t.
             super___uniq_ptr_impl<ELFIO::elf_header,_std::default_delete<ELFIO::elf_header>_>._M_t.
             super__Tuple_impl<0UL,_ELFIO::elf_header_*,_std::default_delete<ELFIO::elf_header>_>.
             super__Head_base<0UL,_ELFIO::elf_header_*,_false>._M_head_impl)->_vptr_elf_header[8])()
  ;
  iVar6 = (*((this->header)._M_t.
             super___uniq_ptr_impl<ELFIO::elf_header,_std::default_delete<ELFIO::elf_header>_>._M_t.
             super__Tuple_impl<0UL,_ELFIO::elf_header_*,_std::default_delete<ELFIO::elf_header>_>.
             super__Head_base<0UL,_ELFIO::elf_header_*,_false>._M_head_impl)->_vptr_elf_header[0x18]
          )();
  iVar7 = (*((this->header)._M_t.
             super___uniq_ptr_impl<ELFIO::elf_header,_std::default_delete<ELFIO::elf_header>_>._M_t.
             super__Tuple_impl<0UL,_ELFIO::elf_header_*,_std::default_delete<ELFIO::elf_header>_>.
             super__Head_base<0UL,_ELFIO::elf_header_*,_false>._M_head_impl)->_vptr_elf_header[0x1a]
          )();
  lVar12 = CONCAT44(extraout_var,iVar7);
  uVar13 = (ushort)iVar6;
  if ((((ushort)uVar5 < 0x40 && (char)iVar4 == '\x02') && uVar13 != 0) ||
     (((ushort)uVar5 < 0x28 && (char)iVar4 == '\x01') && uVar13 != 0)) {
    bVar10 = false;
  }
  else {
    if (uVar13 != 0) {
      uVar14 = (ulong)uVar13;
      do {
        psVar8 = create_section(this);
        (*psVar8->_vptr_section[0x24])(psVar8,stream,lVar12,0,(ulong)is_lazy);
        iVar4 = (*psVar8->_vptr_section[0x11])(psVar8);
        local_58[0] = (long *)CONCAT44(extraout_var_00,iVar4);
        (*psVar8->_vptr_section[0x12])(psVar8,local_58);
        lVar12 = lVar12 + (ulong)(uVar5 & 0xffff);
        uVar14 = uVar14 - 1;
      } while (uVar14 != 0);
    }
    peVar1 = (this->header)._M_t.
             super___uniq_ptr_impl<ELFIO::elf_header,_std::default_delete<ELFIO::elf_header>_>._M_t.
             super__Tuple_impl<0UL,_ELFIO::elf_header_*,_std::default_delete<ELFIO::elf_header>_>.
             super__Head_base<0UL,_ELFIO::elf_header_*,_false>._M_head_impl;
    bVar10 = true;
    if (peVar1 != (elf_header *)0x0) {
      uVar5 = (*peVar1->_vptr_elf_header[0x20])();
      if ((short)uVar5 != 0) {
        peVar2 = (this->sections).parent;
        puVar3 = (peVar2->sections_).
                 super__Vector_base<std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>,_std::allocator<std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if ((ulong)(uVar5 & 0xffff) <
            (ulong)((long)(peVar2->sections_).
                          super__Vector_base<std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>,_std::allocator<std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)puVar3 >> 3)) {
          local_38._M_head_impl =
               *(section **)
                &puVar3[uVar5 & 0xffff]._M_t.
                 super___uniq_ptr_impl<ELFIO::section,_std::default_delete<ELFIO::section>_>;
        }
        else {
          local_38._M_head_impl = (section *)0x0;
        }
        if (uVar13 != 0) {
          uVar14 = 0;
          do {
            index = (**(code **)(*(long *)(((this->sections).parent)->sections_).
                                          super__Vector_base<std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>,_std::allocator<std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start[uVar14]._M_t.
                                          super___uniq_ptr_impl<ELFIO::section,_std::default_delete<ELFIO::section>_>
                                + 0xa8))();
            __s = string_section_accessor_template<ELFIO::section>::get_string
                            ((string_section_accessor_template<ELFIO::section> *)&local_38,index);
            if (__s != (char *)0x0) {
              peVar2 = (this->sections).parent;
              puVar3 = (peVar2->sections_).
                       super__Vector_base<std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>,_std::allocator<std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              if (uVar14 < (ulong)((long)(peVar2->sections_).
                                         super__Vector_base<std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>,_std::allocator<std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish - (long)puVar3
                                  >> 3)) {
                _Var11._M_head_impl =
                     *(section **)
                      &puVar3[uVar14]._M_t.
                       super___uniq_ptr_impl<ELFIO::section,_std::default_delete<ELFIO::section>_>;
              }
              else {
                _Var11._M_head_impl = (section *)0x0;
              }
              local_58[0] = local_48;
              sVar9 = strlen(__s);
              std::__cxx11::string::_M_construct<char_const*>((string *)local_58,__s,__s + sVar9);
              (**(code **)(*(long *)_Var11._M_head_impl + 0x20))
                        (_Var11._M_head_impl,(string *)local_58);
              if (local_58[0] != local_48) {
                operator_delete(local_58[0],local_48[0] + 1);
              }
            }
            uVar14 = uVar14 + 1;
          } while (uVar13 != uVar14);
        }
        bVar10 = true;
      }
    }
  }
  return bVar10;
}

Assistant:

bool load_sections( std::istream& stream, bool is_lazy )
    {
        unsigned char file_class = header->get_class();
        Elf_Half      entry_size = header->get_section_entry_size();
        Elf_Half      num        = header->get_sections_num();
        Elf64_Off     offset     = header->get_sections_offset();

        if ( ( num != 0 && file_class == ELFCLASS64 &&
               entry_size < sizeof( Elf64_Shdr ) ) ||
             ( num != 0 && file_class == ELFCLASS32 &&
               entry_size < sizeof( Elf32_Shdr ) ) ) {
            return false;
        }

        for ( Elf_Half i = 0; i < num; ++i ) {
            section* sec = create_section();

            // Load return value is ignored here
            // This allows retrieval of information from corrupted sections
            sec->load( stream,
                       static_cast<std::streamoff>( offset ) +
                           static_cast<std::streampos>( i ) * entry_size,
                       is_lazy );
            // To mark that the section is not permitted to reassign address
            // during layout calculation
            sec->set_address( sec->get_address() );
        }

        if ( Elf_Half shstrndx = get_section_name_str_index();
             SHN_UNDEF != shstrndx ) {
            string_section_accessor str_reader( sections[shstrndx] );
            for ( Elf_Half i = 0; i < num; ++i ) {
                Elf_Word section_offset = sections[i]->get_name_string_offset();
                const char* p = str_reader.get_string( section_offset );
                if ( p != nullptr ) {
                    sections[i]->set_name( p );
                }
            }
        }

        return true;
    }